

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O3

void __thiscall
llvm::SmallVectorMemoryBuffer::~SmallVectorMemoryBuffer(SmallVectorMemoryBuffer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_MemoryBuffer)._vptr_MemoryBuffer =
       (_func_int **)&PTR__SmallVectorMemoryBuffer_001ffdd0;
  pcVar2 = (this->BufferName)._M_dataplus._M_p;
  paVar1 = &(this->BufferName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if ((string *)*(undefined1 **)&this->SV != &this->BufferName) {
    free(*(undefined1 **)&this->SV);
    return;
  }
  return;
}

Assistant:

SmallVectorMemoryBuffer::~SmallVectorMemoryBuffer() {}